

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlrelationaltablemodel.cpp
# Opt level: O3

QString * __thiscall
QSqlRelationalTableModel::orderByClause
          (QString *__return_storage_ptr__,QSqlRelationalTableModel *this)

{
  long lVar1;
  long *plVar2;
  long lVar3;
  QSqlRelationalTableModelPrivate *this_00;
  QArrayData *pQVar4;
  long lVar5;
  QArrayData *pQVar6;
  long in_FS_OFFSET;
  long local_a0;
  Data *local_98;
  QArrayData *local_90;
  QString local_80;
  QString local_68;
  QList<QSharedPointer<QRelation>_> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(this + 8);
  QList<QSharedPointer<QRelation>_>::value(&local_50,lVar1 + 0x2e8);
  if (&(local_50.d.d)->super_QArrayData == (QArrayData *)0x0) {
    local_90 = (QArrayData *)0x0;
    lVar5 = 0;
    pQVar6 = (QArrayData *)0x0;
    lVar3 = 0;
    pQVar4 = (QArrayData *)0x0;
    local_98 = (Data *)0x0;
    local_a0 = 0;
  }
  else {
    plVar2 = *(long **)(*(long *)(lVar1 + 0x2f0) + (long)*(int *)(lVar1 + 0x230) * 0x10);
    local_90 = (QArrayData *)*plVar2;
    lVar5 = plVar2[2];
    if (local_90 != (QArrayData *)0x0) {
      LOCK();
      (local_90->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_90->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    pQVar6 = (QArrayData *)plVar2[3];
    lVar3 = plVar2[5];
    if (pQVar6 != (QArrayData *)0x0) {
      LOCK();
      (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    pQVar4 = (QArrayData *)plVar2[6];
    local_98 = (Data *)plVar2[7];
    local_a0 = plVar2[8];
    if (pQVar4 == (QArrayData *)0x0) {
      pQVar4 = (QArrayData *)0x0;
    }
    else {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  QSharedPointer<QRelation>::deref((Data *)local_50.d.ptr);
  if (((lVar5 == 0) || (lVar3 == 0)) || (local_a0 == 0)) {
    QSqlTableModel::orderByClause(__return_storage_ptr__,(QSqlTableModel *)this);
  }
  else {
    local_68.d.size = -0x5555555555555556;
    local_68.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_68.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    QString::number((int)&local_50,*(int *)(lVar1 + 0x230));
    this_00 = (QSqlRelationalTableModelPrivate *)0x0;
    plVar2 = (long *)QString::insert((longlong)&local_50,(QLatin1String)(ZEXT816(9) << 0x40));
    local_80.d.d = (Data *)*plVar2;
    local_80.d.ptr = (char16_t *)plVar2[1];
    local_80.d.size = plVar2[2];
    if ((QArrayData *)local_80.d.d != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_80.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_80.d.d)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        this_00 = (QSqlRelationalTableModelPrivate *)0x2;
        QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
      }
    }
    local_50.d.ptr = (QSharedPointer<QRelation> *)local_98;
    local_50.d.size = local_a0;
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_50.d.d = (Data *)pQVar4;
    QSqlRelationalTableModelPrivate::fullyQualifiedFieldName
              (&local_68,this_00,&local_80,(QString *)&local_50);
    if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_80.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_80.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (*(int *)(lVar1 + 0x234) == 0) {
      QSqlQueryModelSql::asc((QString *)&local_50,&local_68);
    }
    else {
      QSqlQueryModelSql::desc((QString *)&local_50,&local_68);
    }
    QString::operator=(&local_68,(QString *)&local_50);
    if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
      }
    }
    QSqlQueryModelSql::orderBy(__return_storage_ptr__,&local_68);
    if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (pQVar4 != (QArrayData *)0x0) {
    LOCK();
    (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar4,2,0x10);
    }
  }
  if (pQVar6 != (QArrayData *)0x0) {
    LOCK();
    (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar6->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar6,2,0x10);
    }
  }
  if (local_90 != (QArrayData *)0x0) {
    LOCK();
    (local_90->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_90->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_90->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_90,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QSqlRelationalTableModel::orderByClause() const
{
    Q_D(const QSqlRelationalTableModel);

    const QSqlRelation rel = d->relations.value(d->sortColumn) ? d->relations.at(d->sortColumn)->rel : QSqlRelation();
    if (!rel.isValid())
        return QSqlTableModel::orderByClause();

    QString f = d->fullyQualifiedFieldName(SqlrTm::relTablePrefix(d->sortColumn), rel.displayColumn());
    f = d->sortOrder == Qt::AscendingOrder ? SqlrTm::asc(f) : SqlrTm::desc(f);
    return SqlrTm::orderBy(f);
}